

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

void __thiscall cs::object_method::object_method(object_method *this,object_method *param_2)

{
  proxy *ppVar1;
  
  ppVar1 = (param_2->object).mDat;
  if (ppVar1 != (proxy *)0x0) {
    ppVar1->refcount = ppVar1->refcount + 1;
  }
  (this->object).mDat = ppVar1;
  ppVar1 = (param_2->callable).mDat;
  if (ppVar1 != (proxy *)0x0) {
    ppVar1->refcount = ppVar1->refcount + 1;
  }
  (this->callable).mDat = ppVar1;
  this->is_request_fold = param_2->is_request_fold;
  return;
}

Assistant:

proxy *duplicate() const noexcept
		{
			if (mDat != nullptr) {
				++mDat->refcount;
			}
			return mDat;
		}